

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i18n.cpp
# Opt level: O2

string * __thiscall
I18N::FormatV(string *__return_storage_ptr__,I18N *this,string *id,
             vector<util::variant,_std::allocator<util::variant>_> *v)

{
  pointer pvVar1;
  bool bVar2;
  int iVar3;
  iterator iVar4;
  size_type sVar5;
  pointer pvVar6;
  string number_buffer;
  string format;
  variant x;
  
  iVar4 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)(this->lang_config)._M_t.
                    super___uniq_ptr_impl<Config,_std::default_delete<Config>_>._M_t.
                    super__Tuple_impl<0UL,_Config_*,_std::default_delete<Config>_>.
                    super__Head_base<0UL,_Config_*,_false>._M_head_impl,id);
  if (iVar4.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_true>
      ._M_cur == (__node_type *)0x0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)id);
    pvVar1 = (v->super__Vector_base<util::variant,_std::allocator<util::variant>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    for (pvVar6 = (v->super__Vector_base<util::variant,_std::allocator<util::variant>_>)._M_impl.
                  super__Vector_impl_data._M_start; pvVar6 != pvVar1; pvVar6 = pvVar6 + 1) {
      util::variant::variant(&x,pvVar6);
      util::variant::GetString_abi_cxx11_(&number_buffer,&x);
      std::operator+(&format," ",&number_buffer);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&format);
      std::__cxx11::string::~string((string *)&number_buffer);
      std::__cxx11::string::~string((string *)&x.val_string);
    }
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    util::variant::GetString_abi_cxx11_
              (&format,(variant *)
                       ((long)iVar4.
                              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_true>
                              ._M_cur + 0x28));
    number_buffer._M_dataplus._M_p = (pointer)&number_buffer.field_2;
    number_buffer._M_string_length = 0;
    number_buffer.field_2._M_local_buf[0] = '\0';
    bVar2 = false;
    for (sVar5 = 0; format._M_string_length != sVar5; sVar5 = sVar5 + 1) {
      if (bVar2) {
        if (format._M_dataplus._M_p[sVar5] == '}') {
          util::variant::variant(&x,&number_buffer);
          iVar3 = util::variant::GetInt(&x);
          std::__cxx11::string::~string((string *)&x.val_string);
          pvVar6 = (v->super__Vector_base<util::variant,_std::allocator<util::variant>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          if ((ulong)(long)(iVar3 + -1) <
              (ulong)((long)(v->super__Vector_base<util::variant,_std::allocator<util::variant>_>).
                            _M_impl.super__Vector_impl_data._M_finish - (long)pvVar6 >> 6)) {
            util::variant::GetString_abi_cxx11_((string *)&x,pvVar6 + (iVar3 + -1));
            std::__cxx11::string::append((string *)__return_storage_ptr__);
            std::__cxx11::string::~string((string *)&x);
          }
          else {
            std::__cxx11::string::append((char *)__return_storage_ptr__);
          }
          std::__cxx11::string::assign((char *)&number_buffer);
LAB_00154ad6:
          bVar2 = false;
        }
        else {
          std::__cxx11::string::push_back((char)&number_buffer);
          bVar2 = true;
        }
      }
      else {
        bVar2 = true;
        if (format._M_dataplus._M_p[sVar5] != '{') {
          std::__cxx11::string::push_back((char)__return_storage_ptr__);
          goto LAB_00154ad6;
        }
      }
    }
    std::__cxx11::string::~string((string *)&number_buffer);
    std::__cxx11::string::~string((string *)&format);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string I18N::FormatV(const std::string& id, std::vector<util::variant> &&v) const
{
	auto it = lang_config->find(id);

	if (it == lang_config->end())
	{
		std::string result = id;

		UTIL_FOREACH(v, x)
		{
			result += " " + std::string(x);
		}

		return result;
	}

	std::string result;
	std::string format = std::string(it->second);
	std::string number_buffer;
	int state = 0;

	UTIL_FOREACH(format, c)
	{
		if (state == 0)
		{
			if (c == '{')
			{
				state = 1;
			}
			else
			{
				result += c;
			}
		}
		else if (state == 1)
		{
			if (c == '}')
			{
				std::size_t index = int(util::variant(number_buffer)) - 1;

				if (index >= v.size())
					result += "#ERROR#";
				else
					result += std::string(v[index]);

				number_buffer = "";
				state = 0;
			}
			else
			{
				number_buffer += c;
			}
		}
	}

	return result;
}